

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::InitializeCreateIndexScan
          (RowGroupCollection *this,CreateIndexScanState *state)

{
  bool bVar1;
  mutex_type *pmVar2;
  RowGroupSegmentTree *pRVar3;
  unique_lock<std::mutex> local_20;
  
  pRVar3 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  ::std::unique_lock<std::mutex>::unique_lock
            (&local_20,&(pRVar3->super_SegmentTree<duckdb::RowGroup,_true>).node_lock);
  pmVar2 = (state->segment_lock).lock._M_device;
  (state->segment_lock).lock._M_device = local_20._M_device;
  bVar1 = (state->segment_lock).lock._M_owns;
  (state->segment_lock).lock._M_owns = local_20._M_owns;
  local_20._M_device = pmVar2;
  local_20._M_owns = bVar1;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void RowGroupCollection::InitializeCreateIndexScan(CreateIndexScanState &state) {
	state.segment_lock = row_groups->Lock();
}